

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmkicon.c
# Opt level: O0

Pixmap make_Xicon(DspInterface dsp)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined4 local_b0;
  undefined4 local_ac;
  XImage IconImage;
  undefined1 local_20 [4];
  int y_hot;
  int x_hot;
  int value;
  uint height;
  uint width;
  DspInterface dsp_local;
  
  _height = dsp;
  memset(&local_b0,0,0x88);
  puVar1 = local_20;
  puVar2 = (undefined1 *)((long)&IconImage.f.add_pixel + 4);
  y_hot = XReadBitmapFile(_height->display_id,
                          *(undefined8 *)(*(long *)(_height->display_id + 0xe8) + 0x10),
                          iconpixmapfile,&value,&x_hot,&IconPixmap,puVar1,puVar2);
  if (y_hot == 1) {
    local_b0 = 0x58;
    local_ac = 0x3a;
    IconImage.width = 0;
    IconImage.height = 0;
    IconImage._8_8_ = Lisp_icon;
    IconImage.data._0_4_ = 0;
    IconImage.data._4_4_ = 8;
    IconImage.bitmap_unit = 0;
    IconImage.bitmap_bit_order = 1;
    IconImage.bitmap_pad = 0xb;
    IconImage.byte_order = 1;
    IconPixmap = XCreatePixmap(_height->display_id,_height->LispWindow,0x58,0x3a,
                               *(undefined4 *)
                                (*(long *)(_height->display_id + 0xe8) +
                                 (long)*(int *)(_height->display_id + 0xe0) * 0x80 + 0x38));
    XPutImage(_height->display_id,IconPixmap,_height->Copy_GC,&local_b0,0,0,
              (ulong)puVar1 & 0xffffffff00000000,(ulong)puVar2 & 0xffffffff00000000,0x58,0x3a);
  }
  else if (y_hot == 2) {
    fprintf(_stderr,"Iconpixmapfile %s contains invalid bitmap data\n",iconpixmapfile);
  }
  else if (y_hot == 3) {
    fprintf(_stderr,"Not enough memory to allocate icon pixmap\n");
  }
  return IconPixmap;
}

Assistant:

Pixmap make_Xicon(DspInterface dsp)
{
  unsigned int width, height;
  int value, x_hot, y_hot;
  XImage IconImage = {0};


#ifdef TRACE
  printf("In make_Xicon().\n");
#endif
  value = XReadBitmapFile(dsp->display_id, RootWindow(dsp->display_id, 0), iconpixmapfile, &width,
                          &height, &IconPixmap, &x_hot, &y_hot);
  if (value == BitmapOpenFailed) {
    IconImage.width = Lisp_icon_width;
    IconImage.height = Lisp_icon_height;
    IconImage.xoffset = 0;
    IconImage.format = XYBitmap;
    IconImage.data = (char *)Lisp_icon;
#if defined(BYTESWAP)
    IconImage.byte_order = LSBFirst;
#else  /* BYTESWAP */
    IconImage.byte_order = MSBFirst;
#endif /* BYTESWAP */
    IconImage.bitmap_unit = 8;
    IconImage.bitmap_pad = 0;
    IconImage.depth = 1;
    IconImage.bytes_per_line = Lisp_icon_width / 8;
#if defined(X_ICON_IN_X_BITMAP_FORMAT)
    IconImage.bitmap_bit_order = LSBFirst;
#else
    IconImage.bitmap_bit_order = MSBFirst;
#endif

    IconPixmap = XCreatePixmap(
        dsp->display_id, dsp->LispWindow, Lisp_icon_width, Lisp_icon_height,
        (unsigned)DefaultDepthOfScreen(ScreenOfDisplay(dsp->display_id, DefaultScreen(dsp->display_id))));

    XPutImage(dsp->display_id, IconPixmap, dsp->Copy_GC, &IconImage, 0, 0, 0, 0, Lisp_icon_width,
              Lisp_icon_height);

  } else if (value == BitmapFileInvalid)
    (void)fprintf(stderr, "Iconpixmapfile %s contains invalid bitmap data\n", iconpixmapfile);
  else if (value == BitmapNoMemory)
    (void)fprintf(stderr, "Not enough memory to allocate icon pixmap\n");
  return (IconPixmap);
}